

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O3

unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
helics::make_cloning_filter(FilterTypes type,Core *core,string_view delivery,string_view name)

{
  element_type *peVar1;
  Filter *filt;
  Core *extraout_RDX;
  pointer *__ptr;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
  _Var2;
  undefined1 in_stack_00000008 [16];
  
  _Var2.super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>.
  _M_t.super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  _Var2.super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>.
  _M_t.super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl._0_4_ = type;
  filt = (Filter *)operator_new(0x50);
  CloningFilter::CloningFilter
            ((CloningFilter *)filt,(Core *)delivery._M_len,(string_view)in_stack_00000008);
  *(Filter **)
   _Var2.super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>.
   _M_t.super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
   .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl = filt;
  addOperations(filt,(FilterTypes)core,extraout_RDX);
  if ((delivery._M_str != (char *)0x0) &&
     (peVar1 = (filt->filtOp).
               super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    (*peVar1->_vptr_FilterOperations[3])(peVar1,0xc,"add delivery",delivery._M_str,name._M_len);
  }
  return (__uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
          )(tuple<helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>)
           _Var2.
           super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
           .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CloningFilter> make_cloning_filter(FilterTypes type,
                                                   Core* core,
                                                   std::string_view delivery,
                                                   std::string_view name)

{
    auto dfilt = std::make_unique<CloningFilter>(core, name);
    addOperations(dfilt.get(), type, core);
    if (!delivery.empty()) {
        dfilt->addDeliveryEndpoint(delivery);
    }
    return dfilt;
}